

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

void XXH3_initCustomSecret_sse2(void *customSecret,xxh_u64 seed64)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long in_RSI;
  long in_RDI;
  __m128i *dest;
  float *src;
  int i;
  __m128i seed;
  int nbRounds;
  int local_e4;
  
  for (local_e4 = 0; local_e4 < 0xc; local_e4 = local_e4 + 1) {
    lVar3 = (long)(local_e4 << 2) * 4;
    lVar1 = *(long *)(XXH3_kSecret + lVar3 + 8);
    plVar2 = (long *)(in_RDI + (long)local_e4 * 0x10);
    *plVar2 = *(long *)(XXH3_kSecret + lVar3) + in_RSI;
    plVar2[1] = lVar1 - in_RSI;
  }
  return;
}

Assistant:

XXH_FORCE_INLINE XXH_TARGET_SSE2 void XXH3_initCustomSecret_sse2(
    void* XXH_RESTRICT customSecret, xxh_u64 seed64) {
  XXH_STATIC_ASSERT((XXH_SECRET_DEFAULT_SIZE & 15) == 0);
  (void)(&XXH_writeLE64);
  {
    int const nbRounds = XXH_SECRET_DEFAULT_SIZE / sizeof(__m128i);

#if defined(_MSC_VER) && defined(_M_IX86) && _MSC_VER < 1900
    // MSVC 32bit mode does not support _mm_set_epi64x before 2015
    XXH_ALIGN(16)
    const xxh_i64 seed64x2[2] = {(xxh_i64)seed64, -(xxh_i64)seed64};
    __m128i const seed = _mm_load_si128((__m128i const*)seed64x2);
#else
    __m128i const seed = _mm_set_epi64x(-(xxh_i64)seed64, (xxh_i64)seed64);
#endif
    int i;

    XXH_ALIGN(64) const float* const src = (float const*)XXH3_kSecret;
    XXH_ALIGN(XXH_SEC_ALIGN) __m128i* dest = (__m128i*)customSecret;
#if defined(__GNUC__) || defined(__clang__)
    /*
     * On GCC & Clang, marking 'dest' as modified will cause the compiler:
     *   - do not extract the secret from sse registers in the internal loop
     *   - use less common registers, and avoid pushing these reg into stack
     */
    __asm__("" : "+r"(dest));
#endif

    for (i = 0; i < nbRounds; ++i) {
      dest[i] = _mm_add_epi64(_mm_castps_si128(_mm_load_ps(src + i * 4)), seed);
    }
  }
}